

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void dump_buffer(phuff_entropy_ptr entropy)

{
  undefined8 *puVar1;
  int iVar2;
  long in_RDI;
  jpeg_destination_mgr *dest;
  
  puVar1 = *(undefined8 **)(*(long *)(in_RDI + 0x50) + 0x28);
  iVar2 = (*(code *)puVar1[3])(*(undefined8 *)(in_RDI + 0x50));
  if (iVar2 == 0) {
    *(undefined4 *)(**(long **)(in_RDI + 0x50) + 0x28) = 0x18;
    (**(code **)**(undefined8 **)(in_RDI + 0x50))(*(undefined8 *)(in_RDI + 0x50));
  }
  *(undefined8 *)(in_RDI + 0x30) = *puVar1;
  *(undefined8 *)(in_RDI + 0x38) = puVar1[1];
  return;
}

Assistant:

LOCAL(boolean)
dump_buffer(working_state *state)
/* Empty the output buffer; return TRUE if successful, FALSE if must suspend */
{
  struct jpeg_destination_mgr *dest = state->cinfo->dest;

  if (!(*dest->empty_output_buffer) (state->cinfo))
    return FALSE;
  /* After a successful buffer dump, must reset buffer pointers */
  state->next_output_byte = dest->next_output_byte;
  state->free_in_buffer = dest->free_in_buffer;
  return TRUE;
}